

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shapeutil_coding.cc
# Opt level: O0

TaggedShapeFactory *
s2shapeutil::FullDecodeShapeFactory(TaggedShapeFactory *__return_storage_ptr__,Decoder *decoder)

{
  ShapeDecoder local_38;
  Decoder *local_18;
  Decoder *decoder_local;
  
  local_18 = decoder;
  decoder_local = (Decoder *)__return_storage_ptr__;
  std::function<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>(unsigned_int,Decoder*)>::
  function<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>(&)(unsigned_int,Decoder*),void>
            ((function<std::unique_ptr<S2Shape,std::default_delete<S2Shape>>(unsigned_int,Decoder*)>
              *)&local_38,FullDecodeShape);
  TaggedShapeFactory::TaggedShapeFactory(__return_storage_ptr__,&local_38,local_18);
  std::function<std::unique_ptr<S2Shape,_std::default_delete<S2Shape>_>_(unsigned_int,_Decoder_*)>::
  ~function(&local_38);
  return __return_storage_ptr__;
}

Assistant:

TaggedShapeFactory FullDecodeShapeFactory(Decoder* decoder) {
  return TaggedShapeFactory(FullDecodeShape, decoder);
}